

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_64bit_generated.h
# Opt level: O2

bool __thiscall RootTable::Verify(RootTable *this,Verifier *verifier)

{
  bool bVar1;
  Vector<unsigned_char,_unsigned_int> *vec;
  String *pSVar2;
  Vector64<uint8_t> *pVVar3;
  Vector<const_LeafStruct_*,_unsigned_int> *vec_00;
  Vector64<const_LeafStruct_*> *vec_01;
  Vector<flatbuffers::Offset<WrapperTable>,_unsigned_int> *pVVar4;
  
  bVar1 = flatbuffers::VerifierTemplate<false>::VerifyTableStart(verifier,(uint8_t *)this);
  if ((bVar1) &&
     (bVar1 = flatbuffers::Table::VerifyOffset<unsigned_long>(&this->super_Table,verifier,4), bVar1)
     ) {
    vec = far_vector(this);
    bVar1 = flatbuffers::VerifierTemplate<false>::VerifyVector<unsigned_char,_unsigned_int>
                      (verifier,vec);
    if ((bVar1) &&
       ((bVar1 = flatbuffers::Table::VerifyField<int>(&this->super_Table,verifier,6,4), bVar1 &&
        (bVar1 = flatbuffers::Table::VerifyOffset<unsigned_long>(&this->super_Table,verifier,8),
        bVar1)))) {
      pSVar2 = far_string(this);
      bVar1 = flatbuffers::VerifierTemplate<false>::VerifyString(verifier,pSVar2);
      if ((bVar1) &&
         (bVar1 = flatbuffers::Table::VerifyOffset<unsigned_long>(&this->super_Table,verifier,10),
         bVar1)) {
        pVVar3 = big_vector(this);
        bVar1 = flatbuffers::VerifierTemplate<false>::VerifyVector<unsigned_char,_unsigned_long>
                          (verifier,pVVar3);
        if ((bVar1) &&
           (bVar1 = flatbuffers::Table::VerifyOffset<unsigned_int>(&this->super_Table,verifier,0xc),
           bVar1)) {
          pSVar2 = near_string(this);
          bVar1 = flatbuffers::VerifierTemplate<false>::VerifyString(verifier,pSVar2);
          if ((bVar1) &&
             (bVar1 = flatbuffers::Table::VerifyOffset<unsigned_long>
                                (&this->super_Table,verifier,0xe), bVar1)) {
            pVVar3 = nested_root(this);
            bVar1 = flatbuffers::VerifierTemplate<false>::VerifyVector<unsigned_char,_unsigned_long>
                              (verifier,pVVar3);
            if (bVar1) {
              pVVar3 = nested_root(this);
              bVar1 = flatbuffers::VerifierTemplate<false>::
                      VerifyNestedFlatBuffer<RootTable,_unsigned_long>(verifier,pVVar3,(char *)0x0);
              if (!bVar1) {
                return false;
              }
              bVar1 = flatbuffers::Table::VerifyOffset<unsigned_long>
                                (&this->super_Table,verifier,0x10);
              if (bVar1) {
                vec_00 = far_struct_vector(this);
                bVar1 = flatbuffers::VerifierTemplate<false>::VerifyVector<LeafStruct,_unsigned_int>
                                  (verifier,(Vector<LeafStruct,_unsigned_int> *)vec_00);
                if ((bVar1) &&
                   (bVar1 = flatbuffers::Table::VerifyOffset<unsigned_long>
                                      (&this->super_Table,verifier,0x12), bVar1)) {
                  vec_01 = big_struct_vector(this);
                  bVar1 = flatbuffers::VerifierTemplate<false>::
                          VerifyVector<LeafStruct,_unsigned_long>
                                    (verifier,(Vector<LeafStruct,_unsigned_long> *)vec_01);
                  if ((bVar1) &&
                     (bVar1 = flatbuffers::Table::VerifyOffset<unsigned_int>
                                        (&this->super_Table,verifier,0x14), bVar1)) {
                    pVVar4 = many_vectors(this);
                    bVar1 = flatbuffers::VerifierTemplate<false>::
                            VerifyVector<flatbuffers::Offset<WrapperTable>,_unsigned_int>
                                      (verifier,pVVar4);
                    if (bVar1) {
                      pVVar4 = many_vectors(this);
                      bVar1 = flatbuffers::VerifierTemplate<false>::
                              VerifyVectorOfTables<WrapperTable>(verifier,pVVar4);
                      if ((bVar1) &&
                         (bVar1 = flatbuffers::Table::VerifyOffset<unsigned_long>
                                            (&this->super_Table,verifier,0x16), bVar1)) {
                        pVVar3 = forced_aligned_vector(this);
                        bVar1 = flatbuffers::VerifierTemplate<false>::
                                VerifyVector<unsigned_char,_unsigned_long>(verifier,pVVar3);
                        if (bVar1) {
                          verifier->depth_ = verifier->depth_ - 1;
                          return true;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool Verify(::flatbuffers::Verifier &verifier) const {
    return VerifyTableStart(verifier) &&
           VerifyOffset64(verifier, VT_FAR_VECTOR) &&
           verifier.VerifyVector(far_vector()) &&
           VerifyField<int32_t>(verifier, VT_A, 4) &&
           VerifyOffset64(verifier, VT_FAR_STRING) &&
           verifier.VerifyString(far_string()) &&
           VerifyOffset64(verifier, VT_BIG_VECTOR) &&
           verifier.VerifyVector(big_vector()) &&
           VerifyOffset(verifier, VT_NEAR_STRING) &&
           verifier.VerifyString(near_string()) &&
           VerifyOffset64(verifier, VT_NESTED_ROOT) &&
           verifier.VerifyVector(nested_root()) &&
           verifier.VerifyNestedFlatBuffer<RootTable>(nested_root(), nullptr) &&
           VerifyOffset64(verifier, VT_FAR_STRUCT_VECTOR) &&
           verifier.VerifyVector(far_struct_vector()) &&
           VerifyOffset64(verifier, VT_BIG_STRUCT_VECTOR) &&
           verifier.VerifyVector(big_struct_vector()) &&
           VerifyOffset(verifier, VT_MANY_VECTORS) &&
           verifier.VerifyVector(many_vectors()) &&
           verifier.VerifyVectorOfTables(many_vectors()) &&
           VerifyOffset64(verifier, VT_FORCED_ALIGNED_VECTOR) &&
           verifier.VerifyVector(forced_aligned_vector()) &&
           verifier.EndTable();
  }